

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void __thiscall duckdb::Linenoise::EditSwapCharacter(Linenoise *this)

{
  char *__src;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t __n;
  int iVar5;
  size_t __n_00;
  ulong len;
  int iVar6;
  char temp_buffer [128];
  undefined1 local_b8 [136];
  
  sVar2 = this->pos;
  if ((sVar2 != 0) && (len = this->len, 1 < len)) {
    if (len < sVar2 + 1) {
      sVar2 = Utf8Proc::PreviousGraphemeCluster(this->buf,len,sVar2);
      this->pos = sVar2;
      len = this->len;
    }
    sVar3 = Utf8Proc::PreviousGraphemeCluster(this->buf,len,sVar2);
    sVar4 = Utf8Proc::NextGraphemeCluster(this->buf,this->len,this->pos);
    pcVar1 = this->buf;
    sVar2 = this->pos;
    iVar6 = (int)sVar3;
    iVar5 = (int)sVar2;
    __src = pcVar1 + iVar6;
    __n = (size_t)(iVar5 - iVar6);
    switchD_00b03519::default(local_b8,__src,__n);
    __n_00 = (size_t)((int)sVar4 - iVar5);
    memmove(__src,pcVar1 + sVar2,__n_00);
    switchD_00b03519::default(this->buf + __n_00 + (long)iVar6,local_b8,__n);
    this->pos = (long)(int)sVar4;
    RefreshLine(this);
  }
  return;
}

Assistant:

void Linenoise::EditSwapCharacter() {
	if (pos == 0 || len < 2) {
		return;
	}
	char temp_buffer[128];
	if (pos + 1 > len) {
		pos = PrevChar();
	}
	int prev_pos = PrevChar();
	int next_pos = NextChar();
	int prev_char_size = pos - prev_pos;
	int cur_char_size = next_pos - pos;
	memcpy(temp_buffer, buf + prev_pos, prev_char_size);
	memmove(buf + prev_pos, buf + pos, cur_char_size);
	memcpy(buf + prev_pos + cur_char_size, temp_buffer, prev_char_size);
	pos = next_pos;
	RefreshLine();
}